

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  uint64_t *puVar2;
  int count;
  int iVar3;
  char *pcVar4;
  secp256k1_scratch_space *psVar6;
  secp256k1_scalar *psVar7;
  secp256k1_gej *r;
  code *pcVar8;
  int iVar9;
  long lVar10;
  size_t __size;
  size_t count_00;
  bench_data data;
  uchar buf [32];
  int in_stack_fffffffffffffe98;
  int local_160;
  uchar local_15c [7];
  undefined1 local_155;
  undefined2 local_154;
  secp256k1_context *local_150;
  secp256k1_gej *local_148;
  secp256k1_ge *local_140;
  secp256k1_scalar *local_138;
  bench_data local_130;
  secp256k1_sha256 local_c8;
  uchar local_58 [40];
  long lVar5;
  
  pcVar4 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar4 == (char *)0x0) {
    count = 10000;
  }
  else {
    lVar5 = strtol(pcVar4,(char **)0x0,0);
    count = (int)lVar5;
  }
  local_130.ecmult_multi = secp256k1_ecmult_multi_var;
  if (argc < 2) goto LAB_00120bf4;
  lVar10 = (ulong)(uint)argc << 3;
  lVar5 = 8;
  do {
    pcVar4 = *(char **)((long)argv + lVar5);
    if (((*pcVar4 == '-') && (pcVar4[1] == 'h')) && (pcVar4[2] == '\0')) goto LAB_00120b36;
    lVar5 = lVar5 + 8;
  } while (lVar10 != lVar5);
  lVar5 = 8;
  do {
    if (lVar10 == lVar5) {
      lVar5 = 8;
      goto LAB_00120b1d;
    }
    iVar3 = strcmp(*(char **)((long)argv + lVar5),"--help");
    lVar5 = lVar5 + 8;
  } while (iVar3 != 0);
  goto LAB_00120b36;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar5),"pippenger_wnaf");
    lVar5 = lVar5 + 8;
    if (iVar3 == 0) break;
LAB_00120b50:
    if (lVar10 == lVar5) {
      lVar5 = 8;
      goto LAB_00120b8b;
    }
  }
  puts("Using pippenger_wnaf:");
  local_130.ecmult_multi = secp256k1_ecmult_pippenger_batch_single;
  goto LAB_00120bf4;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar5),"strauss_wnaf");
    lVar5 = lVar5 + 8;
    if (iVar3 == 0) break;
LAB_00120b8b:
    if (lVar10 == lVar5) {
      lVar5 = 8;
      goto LAB_00120bcb;
    }
  }
  puts("Using strauss_wnaf:");
  local_130.ecmult_multi = secp256k1_ecmult_strauss_batch_single;
  goto LAB_00120bf4;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar5),"help");
    lVar5 = lVar5 + 8;
    if (iVar3 == 0) break;
LAB_00120b1d:
    if (lVar10 == lVar5) {
      lVar5 = 8;
      goto LAB_00120b50;
    }
  }
LAB_00120b36:
  help(argv);
  return 0;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar5),"simple");
    lVar5 = lVar5 + 8;
    if (iVar3 == 0) break;
LAB_00120bcb:
    if (lVar10 == lVar5) goto LAB_00121111;
  }
  puts("Using simple algorithm:");
LAB_00120bf4:
  local_150 = secp256k1_context_create(1);
  lVar5 = 8;
  psVar6 = (secp256k1_scratch_space *)0x0;
  local_130.ctx = local_150;
  do {
    if ((long)argc * 8 == lVar5) {
      psVar6 = (secp256k1_scratch_space *)malloc(0x4580070);
      if (psVar6 == (secp256k1_scratch_space *)0x0) {
        (*(local_150->error_callback).fn)("Out of memory",(local_150->error_callback).data);
      }
      else {
        psVar6->alloc_size = 0;
        builtin_memcpy(psVar6->magic,"scratch",8);
        psVar6->data = psVar6 + 1;
        psVar6->max_size = 0x4580050;
      }
      break;
    }
    iVar3 = strcmp(*(char **)((long)argv + lVar5),"simple");
    lVar5 = lVar5 + 8;
  } while (iVar3 != 0);
  local_130.scratch = psVar6;
  local_150 = (secp256k1_context *)malloc(0x100000);
  local_130.scalars = (secp256k1_scalar *)local_150;
  psVar7 = (secp256k1_scalar *)malloc(0x100000);
  local_130.seckeys = psVar7;
  local_140 = (secp256k1_ge *)malloc(0x2c0000);
  local_130.pubkeys = local_140;
  r = (secp256k1_gej *)malloc(0x400000);
  __size = (long)count * 0x80 + 0x80;
  local_130.pubkeys_gej = r;
  local_130.expected_output = (secp256k1_gej *)malloc(__size);
  local_130.output = (secp256k1_gej *)malloc(__size);
  r->infinity = 0;
  (r->x).n[4] = 0x79be667ef9dc;
  (r->x).n[2] = 0xe870b07029bfc;
  (r->x).n[3] = 0xbbac55a06295c;
  (r->x).n[0] = 0x2815b16f81798;
  (r->x).n[1] = 0xdb2dce28d959f;
  (r->y).n[4] = 0x483ada7726a3;
  (r->y).n[2] = 0xe1108a8fd17b4;
  (r->y).n[3] = 0xc4655da4fbfc0;
  (r->y).n[0] = 0x7d08ffb10d4b8;
  (r->y).n[1] = 0x48a68554199c4;
  (r->z).n[0] = 1;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  psVar7->d[0] = 1;
  psVar7->d[1] = 0;
  psVar7->d[2] = 0;
  psVar7->d[3] = 0;
  lVar10 = 0;
  lVar5 = 0;
  local_148 = r;
  local_138 = psVar7;
  do {
    puVar2 = (uint64_t *)&local_150->ecmult_gen_ctx;
    builtin_memcpy(local_15c,"ecmult",6);
    local_160 = 0;
    local_15c[6] = (uchar)lVar5;
    local_155 = (undefined1)((ulong)lVar5 >> 8);
    local_154 = 0;
    local_c8.s._0_5_ = 0x856a09e667;
    local_c8.s[1]._1_2_ = 0x67ae;
    local_c8.s[1]._3_1_ = 0xbb;
    local_c8.s[2]._0_2_ = 0xf372;
    local_c8.s[2]._2_1_ = 0x6e;
    local_c8.s[2]._3_1_ = 0x3c;
    local_c8.s[3] = 0xa54ff53a;
    local_c8.s[4] = 0x510e527f;
    local_c8.s[5] = 0x9b05688c;
    local_c8.s[6] = 0x1f83d9ab;
    local_c8.s[7] = 0x5be0cd19;
    local_c8.bytes = 0;
    secp256k1_sha256_write(&local_c8,local_15c,10);
    secp256k1_sha256_finalize(&local_c8,local_58);
    secp256k1_scalar_set_b32((secp256k1_scalar *)((long)puVar2 + lVar10),local_58,&local_160);
    if (local_160 != 0) {
      main_cold_1();
LAB_00121111:
      main_cold_2();
      return 1;
    }
    if (lVar10 != 0) {
      if (*(int *)((long)(local_148->x).n + lVar10 * 4 + -8) == 0) {
        secp256k1_gej_double(r,r + -1);
      }
      else {
        puVar1 = (undefined8 *)((long)(local_148->x).n + lVar10 * 4);
        *(int *)((long)(&local_148->z + 1) + lVar10 * 4) = 1;
        puVar1[0xc] = 0;
        puVar1[0xd] = 0;
        puVar1[10] = 0;
        puVar1[0xb] = 0;
        puVar1[8] = 0;
        puVar1[9] = 0;
        puVar1[6] = 0;
        puVar1[7] = 0;
        puVar1[4] = 0;
        puVar1[5] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[0xe] = 0;
      }
      psVar7 = (secp256k1_scalar *)((long)local_138[-1].d + lVar10);
      secp256k1_scalar_add((secp256k1_scalar *)((long)local_138->d + lVar10),psVar7,psVar7);
    }
    lVar5 = lVar5 + 1;
    lVar10 = lVar10 + 0x20;
    r = r + 1;
  } while (lVar10 != 0x100000);
  secp256k1_ge_set_all_gej_var(local_140,local_148,0x8000);
  printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ",
         "    Max(us)    ");
  putchar(10);
  local_130.offset1 = 0x2481;
  local_130.offset2 = 0xf49;
  local_c8.s._0_5_ = 0x6c756d6365;
  local_c8.s[1]._1_2_ = 0x5f74;
  local_c8.s[1]._3_1_ = 0x67;
  local_c8.s[2]._0_2_ = 0x6e65;
  local_c8.s[2]._2_1_ = 0;
  run_benchmark((char *)&local_c8,bench_ecmult_gen,bench_ecmult_setup,bench_ecmult_gen_teardown,
                &local_130,count,in_stack_fffffffffffffe98);
  local_c8.s[2]._0_2_ = 0x6e6f;
  local_c8.s[2]._2_1_ = 0x73;
  local_c8.s[2]._3_1_ = 0x74;
  local_c8.s[3] = local_c8.s[3] & 0xffffff00;
  local_c8.s._0_5_ = 0x6c756d6365;
  local_c8.s[1]._1_2_ = 0x5f74;
  local_c8.s[1]._3_1_ = 99;
  run_benchmark((char *)&local_c8,bench_ecmult_const,bench_ecmult_setup,bench_ecmult_const_teardown,
                &local_130,count,in_stack_fffffffffffffe98);
  local_c8.s._0_5_ = 0x6c756d6365;
  local_c8.s[1]._1_2_ = 0x5f74;
  local_c8.s[1]._3_1_ = 0x31;
  local_c8.s[2]._0_2_ = 0x70;
  run_benchmark((char *)&local_c8,bench_ecmult_1p,bench_ecmult_setup,bench_ecmult_1p_teardown,
                &local_130,count,in_stack_fffffffffffffe98);
  local_c8.s[2]._0_2_ = 0x5f70;
  local_c8.s[2]._2_1_ = 0x67;
  local_c8.s[2]._3_1_ = 0;
  local_c8.s._0_5_ = 0x6c756d6365;
  local_c8.s[1]._1_2_ = 0x5f74;
  local_c8.s[1]._3_1_ = 0x30;
  run_benchmark((char *)&local_c8,bench_ecmult_0p_g,bench_ecmult_setup,bench_ecmult_0p_g_teardown,
                &local_130,count,in_stack_fffffffffffffe98);
  local_c8.s[2]._0_2_ = 0x5f70;
  local_c8.s[2]._2_1_ = 0x67;
  local_c8.s[2]._3_1_ = 0;
  local_c8.s._0_5_ = 0x6c756d6365;
  local_c8.s[1]._1_2_ = 0x5f74;
  local_c8.s[1]._3_1_ = 0x31;
  pcVar8 = bench_ecmult_1p_g_teardown;
  run_benchmark((char *)&local_c8,bench_ecmult_1p_g,bench_ecmult_setup,bench_ecmult_1p_g_teardown,
                &local_130,count * 2,in_stack_fffffffffffffe98);
  count_00 = 1;
  do {
    run_ecmult_multi_bench(&local_130,count_00,count,(int)pcVar8);
    count_00 = count_00 + 1;
  } while (count_00 != 9);
  if (2 < count) {
    iVar3 = 0;
    do {
      iVar9 = 9;
      do {
        run_ecmult_multi_bench(&local_130,(ulong)(uint)(iVar9 << ((byte)iVar3 & 0x1f)),count,iVar3);
        iVar9 = iVar9 + 1;
      } while (iVar9 != 0x11);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0xc);
  }
  if (local_130.scratch != (secp256k1_scratch_space *)0x0) {
    lVar5 = 0;
    do {
      if ((local_130.scratch)->magic[lVar5] != "scratch"[lVar5]) {
        (*((local_130.ctx)->error_callback).fn)
                  ("invalid scratch space",((local_130.ctx)->error_callback).data);
        goto LAB_001210af;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    free(local_130.scratch);
  }
LAB_001210af:
  secp256k1_context_destroy(local_130.ctx);
  free(local_130.scalars);
  free(local_130.pubkeys);
  free(local_130.pubkeys_gej);
  free(local_130.seckeys);
  free(local_130.output);
  free(local_130.expected_output);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    bench_data data;
    int i, p;
    size_t scratch_size;

    int iters = get_iters(10000);

    data.ecmult_multi = secp256k1_ecmult_multi_var;

    if (argc > 1) {
        if(have_flag(argc, argv, "-h")
           || have_flag(argc, argv, "--help")
           || have_flag(argc, argv, "help")) {
            help(argv);
            return EXIT_SUCCESS;
        } else if(have_flag(argc, argv, "pippenger_wnaf")) {
            printf("Using pippenger_wnaf:\n");
            data.ecmult_multi = secp256k1_ecmult_pippenger_batch_single;
        } else if(have_flag(argc, argv, "strauss_wnaf")) {
            printf("Using strauss_wnaf:\n");
            data.ecmult_multi = secp256k1_ecmult_strauss_batch_single;
        } else if(have_flag(argc, argv, "simple")) {
            printf("Using simple algorithm:\n");
        } else {
            fprintf(stderr, "%s: unrecognized argument '%s'.\n\n", argv[0], argv[1]);
            help(argv);
            return EXIT_FAILURE;
        }
    }

    data.ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    scratch_size = secp256k1_strauss_scratch_size(POINTS) + STRAUSS_SCRATCH_OBJECTS*16;
    if (!have_flag(argc, argv, "simple")) {
        data.scratch = secp256k1_scratch_space_create(data.ctx, scratch_size);
    } else {
        data.scratch = NULL;
    }

    /* Allocate stuff */
    data.scalars = malloc(sizeof(secp256k1_scalar) * POINTS);
    data.seckeys = malloc(sizeof(secp256k1_scalar) * POINTS);
    data.pubkeys = malloc(sizeof(secp256k1_ge) * POINTS);
    data.pubkeys_gej = malloc(sizeof(secp256k1_gej) * POINTS);
    data.expected_output = malloc(sizeof(secp256k1_gej) * (iters + 1));
    data.output = malloc(sizeof(secp256k1_gej) * (iters + 1));

    /* Generate a set of scalars, and private/public keypairs. */
    secp256k1_gej_set_ge(&data.pubkeys_gej[0], &secp256k1_ge_const_g);
    secp256k1_scalar_set_int(&data.seckeys[0], 1);
    for (i = 0; i < POINTS; ++i) {
        generate_scalar(i, &data.scalars[i]);
        if (i) {
            secp256k1_gej_double_var(&data.pubkeys_gej[i], &data.pubkeys_gej[i - 1], NULL);
            secp256k1_scalar_add(&data.seckeys[i], &data.seckeys[i - 1], &data.seckeys[i - 1]);
        }
    }
    secp256k1_ge_set_all_gej_var(data.pubkeys, data.pubkeys_gej, POINTS);


    print_output_table_header_row();
    /* Initialize offset1 and offset2 */
    hash_into_offset(&data, 0);
    run_ecmult_bench(&data, iters);

    for (i = 1; i <= 8; ++i) {
        run_ecmult_multi_bench(&data, i, 1, iters);
    }

    /* This is disabled with low count of iterations because the loop runs 77 times even with iters=1
    * and the higher it goes the longer the computation takes(more points)
    * So we don't run this benchmark with low iterations to prevent slow down */
     if (iters > 2) {
        for (p = 0; p <= 11; ++p) {
            for (i = 9; i <= 16; ++i) {
                run_ecmult_multi_bench(&data, i << p, 1, iters);
            }
        }
    }

    if (data.scratch != NULL) {
        secp256k1_scratch_space_destroy(data.ctx, data.scratch);
    }
    secp256k1_context_destroy(data.ctx);
    free(data.scalars);
    free(data.pubkeys);
    free(data.pubkeys_gej);
    free(data.seckeys);
    free(data.output);
    free(data.expected_output);

    return EXIT_SUCCESS;
}